

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraceCalls.cpp
# Opt level: O3

void __thiscall
wasm::TraceCalls::parseFunctionName
          (TraceCalls *this,string *str,string *originName,string *traceName)

{
  pointer pcVar1;
  long lVar2;
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0 [23];
  undefined1 local_48 [8];
  Split parts;
  
  pcVar1 = local_1d0 + 0x10;
  local_1d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,":","");
  String::Split::Split((Split *)local_48,str,(string *)local_1d0);
  if ((pointer)local_1d0._0_8_ != pcVar1) {
    operator_delete((void *)local_1d0._0_8_,local_1c0[0]._M_allocated_capacity + 1);
  }
  lVar2 = (long)parts.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)local_48 >> 5;
  if (lVar2 == 1) {
    std::__cxx11::string::_M_assign((string *)originName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   "trace_",originName);
    std::__cxx11::string::operator=((string *)traceName,(string *)local_1d0);
    if ((pointer)local_1d0._0_8_ != pcVar1) {
      operator_delete((void *)local_1d0._0_8_,local_1c0[0]._M_allocated_capacity + 1);
    }
  }
  else {
    if (lVar2 != 2) {
      Fatal::Fatal((Fatal *)local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1d0 + 0x10),"Failed to parse function name (\'",0x20);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1d0 + 0x10),(str->_M_dataplus)._M_p,str->_M_string_length);
      Fatal::operator<<((Fatal *)local_1d0,
                        (char (*) [52])"\'): expected format FUNCTION_TO_TRACE[:TRACER_NAME]");
      Fatal::~Fatal((Fatal *)local_1d0);
    }
    std::__cxx11::string::_M_assign((string *)originName);
    std::__cxx11::string::_M_assign((string *)traceName);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return;
}

Assistant:

void parseFunctionName(const std::string& str,
                         std::string& originName,
                         std::string& traceName) {
    auto parts = String::Split(str, ":");
    switch (parts.size()) {
      case 1:
        originName = parts[0];
        traceName = "trace_" + originName;
        break;
      case 2:
        originName = parts[0];
        traceName = parts[1];
        break;
      default:
        Fatal() << "Failed to parse function name ('" << str
                << "'): expected format FUNCTION_TO_TRACE[:TRACER_NAME]";
    }
  }